

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O3

void __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::StoreComponentOfValueTo
          (InterfaceVariableScalarReplacement *this,uint32_t component_type_id,uint32_t value_id,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *component_indices,Instruction *ptr,
          uint32_t *extra_array_index,Instruction *insert_before)

{
  IRContext *this_00;
  DefUseManager *this_01;
  array<signed_char,_4UL> aVar1;
  Instruction *this_02;
  Instruction *this_03;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_a0;
  InterfaceVariableScalarReplacement *local_98;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_90;
  undefined1 local_88 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_68;
  undefined1 local_60 [40];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_38;
  
  this_02 = CreateCompositeExtract
                      (this,component_type_id,value_id,component_indices,extra_array_index);
  local_a0._M_head_impl = this_02;
  this_03 = (Instruction *)operator_new(0x70);
  local_98 = this;
  Instruction::Instruction(this_03,(this->super_Pass).context_,OpStore);
  local_88[0x10] = '\0';
  local_88[0x11] = '\0';
  local_88[0x12] = '\0';
  local_88[0x13] = '\0';
  local_90._M_head_impl = this_03;
  if (ptr->has_result_id_ == true) {
    local_88._16_4_ = Instruction::GetSingleWordOperand(ptr,(uint)ptr->has_type_id_);
  }
  local_88._0_8_ = &PTR__SmallVector_00b02ef8;
  local_68._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_88._8_8_ = 1;
  local_60._0_4_ = SPV_OPERAND_TYPE_ID;
  local_60._8_8_ = &PTR__SmallVector_00b02ef8;
  local_60._16_8_ = 0;
  local_60._32_8_ = local_60 + 0x18;
  local_38._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_88._24_8_ = local_88 + 0x10;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)(local_60 + 8),
             (SmallVector<unsigned_int,_2UL> *)local_88);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&this_03->operands_,(Operand *)local_60);
  local_60._8_8_ = &PTR__SmallVector_00b02ef8;
  if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )local_38._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_38,local_38._M_head_impl);
  }
  local_38._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_88._0_8_ = &PTR__SmallVector_00b02ef8;
  if (local_68._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_68,local_68._M_head_impl);
  }
  aVar1._M_elems[0] = '\0';
  aVar1._M_elems[1] = '\0';
  aVar1._M_elems[2] = '\0';
  aVar1._M_elems[3] = '\0';
  if (this_02->has_result_id_ == true) {
    aVar1._M_elems = (_Type)Instruction::GetSingleWordOperand(this_02,(uint)this_02->has_type_id_);
  }
  local_88._0_8_ = &PTR__SmallVector_00b02ef8;
  local_68._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_88._8_8_ = 1;
  local_60._0_4_ = SPV_OPERAND_TYPE_ID;
  local_60._8_8_ = &PTR__SmallVector_00b02ef8;
  local_60._16_8_ = 0;
  local_60._32_8_ = local_60 + 0x18;
  local_38._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_88._16_4_ = aVar1._M_elems;
  local_88._24_8_ = local_88 + 0x10;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)(local_60 + 8),
             (SmallVector<unsigned_int,_2UL> *)local_88);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&this_03->operands_,(Operand *)local_60);
  local_60._8_8_ = &PTR__SmallVector_00b02ef8;
  if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )local_38._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_38,local_38._M_head_impl);
  }
  local_38._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_88._0_8_ = &PTR__SmallVector_00b02ef8;
  if (local_68._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_68,local_68._M_head_impl);
  }
  this_00 = (local_98->super_Pass).context_;
  if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_00);
  }
  this_01 = (this_00->def_use_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  analysis::DefUseManager::AnalyzeInstDefUse(this_01,this_02);
  analysis::DefUseManager::AnalyzeInstDefUse(this_01,this_03);
  Instruction::InsertBefore
            (insert_before,
             (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              *)&local_a0);
  Instruction::InsertBefore
            (insert_before,
             (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              *)&local_90);
  if (local_90._M_head_impl != (Instruction *)0x0) {
    (*((local_90._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
      _vptr_IntrusiveNodeBase[1])();
  }
  if (local_a0._M_head_impl != (Instruction *)0x0) {
    (*((local_a0._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
      _vptr_IntrusiveNodeBase[1])();
  }
  return;
}

Assistant:

void InterfaceVariableScalarReplacement::StoreComponentOfValueTo(
    uint32_t component_type_id, uint32_t value_id,
    const std::vector<uint32_t>& component_indices, Instruction* ptr,
    const uint32_t* extra_array_index, Instruction* insert_before) {
  std::unique_ptr<Instruction> composite_extract(CreateCompositeExtract(
      component_type_id, value_id, component_indices, extra_array_index));

  std::unique_ptr<Instruction> new_store(
      new Instruction(context(), spv::Op::OpStore));
  new_store->AddOperand({SPV_OPERAND_TYPE_ID, {ptr->result_id()}});
  new_store->AddOperand(
      {SPV_OPERAND_TYPE_ID, {composite_extract->result_id()}});

  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  def_use_mgr->AnalyzeInstDefUse(composite_extract.get());
  def_use_mgr->AnalyzeInstDefUse(new_store.get());

  insert_before->InsertBefore(std::move(composite_extract));
  insert_before->InsertBefore(std::move(new_store));
}